

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalPdu.cpp
# Opt level: O2

void __thiscall DIS::SignalPdu::unmarshal(SignalPdu *this,DataStream *dataStream)

{
  pointer puVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint8_t x;
  
  RadioCommunicationsFamilyPdu::unmarshal(&this->super_RadioCommunicationsFamilyPdu,dataStream);
  DataStream::operator>>
            (dataStream,(unsigned_short *)&(this->super_RadioCommunicationsFamilyPdu).field_0x2a);
  DataStream::operator>>
            (dataStream,(unsigned_short *)&(this->super_RadioCommunicationsFamilyPdu).field_0x2c);
  DataStream::operator>>(dataStream,&this->_sampleRate);
  DataStream::operator>>(dataStream,&this->_dataLength);
  DataStream::operator>>(dataStream,&this->_samples);
  puVar1 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  uVar2 = (long)(this->_dataLength + 7) / 8;
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = uVar2 & 0xffffffff;
  }
  while (iVar3 = (int)uVar4, uVar4 = (ulong)(iVar3 - 1), iVar3 != 0) {
    DataStream::operator>>(dataStream,&x);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->_data,&x);
  }
  return;
}

Assistant:

void SignalPdu::unmarshal(DataStream &dataStream)
{
  RadioCommunicationsFamilyPdu::unmarshal(
      dataStream); // unmarshal information in superclass first
  dataStream >> _encodingScheme;
  dataStream >> _tdlType;
  dataStream >> _sampleRate;
  dataStream >> _dataLength;
  dataStream >> _samples;

  _data.clear();
  const int dataLengthBytes = (_dataLength + 7) / 8; // bits to bytes
  for (auto idx = 0; idx < dataLengthBytes; ++idx)
  {
    uint8_t x;
    dataStream >> x;
    _data.push_back(x);
  }
}